

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

void google::protobuf::internal::OutputHelper<google::protobuf::internal::ArrayOutput,_5>::Serialize
               (void *ptr,ArrayOutput *output)

{
  uint8_t *puVar1;
  
  puVar1 = PrimitiveTypeHelper<5>::SerializeToArray(ptr,output->ptr);
  output->ptr = puVar1;
  return;
}

Assistant:

static void Serialize(const void* ptr, ArrayOutput* output) {
    output->ptr = PrimitiveTypeHelper<type>::SerializeToArray(ptr, output->ptr);
  }